

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinKrylovDemo_ls.c
# Opt level: O1

void PrintOutput(N_Vector cc)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar1 = *(long *)((long)cc->content + 0x10);
  lVar2 = 0;
  printf("\nAt bottom left:");
  lVar3 = 0;
  do {
    if (lVar3 == lVar2) {
      putchar(10);
    }
    printf(" %g",*(undefined8 *)(lVar1 + lVar3 * 8));
    lVar3 = lVar3 + 1;
    lVar2 = lVar2 + 6;
  } while (lVar3 != 6);
  lVar1 = *(long *)((long)cc->content + 0x10);
  lVar3 = 0;
  printf("\n\nAt top right:");
  lVar2 = 0;
  do {
    if (lVar2 == lVar3) {
      putchar(10);
    }
    printf(" %g",*(undefined8 *)(lVar1 + 0x480 + lVar2 * 8));
    lVar2 = lVar2 + 1;
    lVar3 = lVar3 + 6;
  } while (lVar2 != 6);
  puts("\n");
  return;
}

Assistant:

static void PrintOutput(N_Vector cc)
{
  int is, jx, jy;
  sunrealtype* ct;

  jy = 0;
  jx = 0;
  ct = IJ_Vptr(cc, jx, jy);
  printf("\nAt bottom left:");

  /* Print out lines with up to 6 values per line */
  for (is = 0; is < NUM_SPECIES; is++)
  {
    if ((is % 6) * 6 == is) { printf("\n"); }
#if defined(SUNDIALS_EXTENDED_PRECISION)
    printf(" %Lg", ct[is]);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
    printf(" %g", ct[is]);
#else
    printf(" %g", ct[is]);
#endif
  }

  jy = MY - 1;
  jx = MX - 1;
  ct = IJ_Vptr(cc, jx, jy);
  printf("\n\nAt top right:");

  /* Print out lines with up to 6 values per line */
  for (is = 0; is < NUM_SPECIES; is++)
  {
    if ((is % 6) * 6 == is) { printf("\n"); }
#if defined(SUNDIALS_EXTENDED_PRECISION)
    printf(" %Lg", ct[is]);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
    printf(" %g", ct[is]);
#else
    printf(" %g", ct[is]);
#endif
  }
  printf("\n\n");
}